

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_pls(CompilerGLSL *this)

{
  pointer pPVar1;
  SPIREntryPoint *pSVar2;
  runtime_error *prVar3;
  PlsRemap *input;
  pointer pPVar4;
  string local_50;
  
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  if (pSVar2->model != ExecutionModelFragment) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Pixel local storage only supported in fragment shaders.","");
    ::std::runtime_error::runtime_error(prVar3,(string *)&local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_0035b0b8;
    __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->options).es != false) {
    if (299 < (this->options).version) {
      if ((this->pls_inputs).
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->pls_inputs).
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        statement<char_const(&)[27]>(this,(char (*) [27])"__pixel_local_inEXT _PLSIn");
        statement<char_const(&)[2]>(this,(char (*) [2])"{");
        this->indent = this->indent + 1;
        pPVar4 = (this->pls_inputs).
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar1 = (this->pls_inputs).
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pPVar4 != pPVar1) {
          do {
            pls_decl_abi_cxx11_(&local_50,this,pPVar4);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&local_50,(char (*) [2])0x2ddbde);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            pPVar4 = pPVar4 + 1;
          } while (pPVar4 != pPVar1);
        }
        end_scope_decl(this);
        statement<char_const(&)[1]>(this,(char (*) [1])0x2dc0a8);
      }
      if ((this->pls_outputs).
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->pls_outputs).
          super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        statement<char_const(&)[29]>(this,(char (*) [29])"__pixel_local_outEXT _PLSOut");
        statement<char_const(&)[2]>(this,(char (*) [2])"{");
        this->indent = this->indent + 1;
        pPVar4 = (this->pls_outputs).
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar1 = (this->pls_outputs).
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pPVar4 != pPVar1) {
          do {
            pls_decl_abi_cxx11_(&local_50,this,pPVar4);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&local_50,(char (*) [2])0x2ddbde);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            pPVar4 = pPVar4 + 1;
          } while (pPVar4 != pPVar1);
        }
        end_scope_decl(this);
        statement<char_const(&)[1]>(this,(char (*) [1])0x2dc0a8);
      }
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Pixel local storage only supported in ESSL 3.0 and above.","");
    ::std::runtime_error::runtime_error(prVar3,(string *)&local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_0035b0b8;
    __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Pixel local storage only supported in OpenGL ES.","");
  ::std::runtime_error::runtime_error(prVar3,(string *)&local_50);
  *(undefined ***)prVar3 = &PTR__runtime_error_0035b0b8;
  __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_pls()
{
	auto &execution = get_entry_point();
	if (execution.model != ExecutionModelFragment)
		SPIRV_CROSS_THROW("Pixel local storage only supported in fragment shaders.");

	if (!options.es)
		SPIRV_CROSS_THROW("Pixel local storage only supported in OpenGL ES.");

	if (options.version < 300)
		SPIRV_CROSS_THROW("Pixel local storage only supported in ESSL 3.0 and above.");

	if (!pls_inputs.empty())
	{
		statement("__pixel_local_inEXT _PLSIn");
		begin_scope();
		for (auto &input : pls_inputs)
			statement(pls_decl(input), ";");
		end_scope_decl();
		statement("");
	}

	if (!pls_outputs.empty())
	{
		statement("__pixel_local_outEXT _PLSOut");
		begin_scope();
		for (auto &output : pls_outputs)
			statement(pls_decl(output), ";");
		end_scope_decl();
		statement("");
	}
}